

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O2

bool iDynTree::CreateModelFromDHChain(DHChain *inputChain,Model *outputModel)

{
  long lVar1;
  int inInt;
  long lVar2;
  ulong dofIdx;
  string baseLinkName;
  string addedJointName;
  string previousLinkName;
  Axis rot_axis_in_parent_frame;
  Transform parent_H_child;
  Transform dhTransform;
  string addedLinkName;
  Axis axisOnZThroughOrigin;
  Link linkDefault;
  RevoluteJoint addedJoint;
  Transform local_158 [96];
  Transform local_f8 [96];
  SpatialInertia inertiaDefault;
  
  Model::Model((Model *)&addedJoint);
  Model::operator=(outputModel,(Model *)&addedJoint);
  Model::~Model((Model *)&addedJoint);
  iDynTree::Position::Zero();
  iDynTree::RotationalInertia::Zero();
  iDynTree::SpatialInertia::SpatialInertia
            (&inertiaDefault,1.0,(Position *)&linkDefault,(RotationalInertia *)&addedJoint);
  Link::Link(&linkDefault);
  Link::setInertia(&linkDefault,&inertiaDefault);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&baseLinkName,"link0",(allocator<char> *)&addedJoint);
  Model::addLink(outputModel,&baseLinkName,&linkDefault);
  std::__cxx11::string::string((string *)&previousLinkName,(string *)&baseLinkName);
  lVar2 = 0x18;
  dofIdx = 0;
  while( true ) {
    if ((ulong)((*(long *)&inputChain->field_0x68 - *(long *)&inputChain->dhParams) / 0x30) <=
        dofIdx) break;
    DHChain::getDOFName_abi_cxx11_(&addedJointName,inputChain,dofIdx);
    intToString_abi_cxx11_((string *)&addedJoint,(iDynTree *)(ulong)((int)dofIdx + 1),inInt);
    std::operator+(&addedLinkName,"link",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addedJoint)
    ;
    std::__cxx11::string::~string((string *)&addedJoint);
    iDynTree::Transform::Transform(&parent_H_child);
    iDynTree::Position::Position(&rot_axis_in_parent_frame.origin);
    iDynTree::Direction::Direction((Direction *)&addedJoint,0.0,0.0,1.0);
    iDynTree::Position::Zero();
    iDynTree::Axis::Axis(&axisOnZThroughOrigin,(Direction *)&addedJoint,(Position *)&dhTransform);
    lVar1 = *(long *)&inputChain->dhParams;
    TransformFromDH((iDynTree *)&dhTransform,*(double *)(lVar1 + -0x18 + lVar2),
                    *(double *)(lVar1 + -8 + lVar2),*(double *)(lVar1 + -0x10 + lVar2),
                    *(double *)(lVar1 + lVar2));
    iDynTree::Transform::operator=(&parent_H_child,&dhTransform);
    iDynTree::Axis::operator=(&rot_axis_in_parent_frame,&axisOnZThroughOrigin);
    RevoluteJoint::RevoluteJoint(&addedJoint,&parent_H_child,&rot_axis_in_parent_frame);
    Model::addJointAndLink
              (outputModel,&previousLinkName,&addedJointName,(IJointConstPtr)&addedJoint,
               &addedLinkName,&linkDefault);
    std::__cxx11::string::_M_assign((string *)&previousLinkName);
    RevoluteJoint::~RevoluteJoint(&addedJoint);
    std::__cxx11::string::~string((string *)&addedLinkName);
    std::__cxx11::string::~string((string *)&addedJointName);
    lVar2 = lVar2 + 0x30;
    dofIdx = dofIdx + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addedJoint,"baseFrame",(allocator<char> *)&parent_H_child);
  iDynTree::Transform::inverse();
  Model::addAdditionalFrameToLink(outputModel,&baseLinkName,(string *)&addedJoint,local_f8);
  std::__cxx11::string::~string((string *)&addedJoint);
  lVar2 = *(long *)&inputChain->field_0x68 - *(long *)&inputChain->dhParams;
  intToString_abi_cxx11_
            ((string *)&parent_H_child,(iDynTree *)(lVar2 / 0x30 & 0xffffffff),(int)(lVar2 % 0x30));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addedJoint,
                 "link",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &parent_H_child);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dhTransform,"distalFrame",(allocator<char> *)&rot_axis_in_parent_frame);
  iDynTree::Transform::Transform(local_158,&inputChain->HN);
  Model::addAdditionalFrameToLink
            (outputModel,(string *)&addedJoint,(string *)&dhTransform,local_158);
  std::__cxx11::string::~string((string *)&dhTransform);
  std::__cxx11::string::~string((string *)&addedJoint);
  std::__cxx11::string::~string((string *)&parent_H_child);
  std::__cxx11::string::~string((string *)&previousLinkName);
  std::__cxx11::string::~string((string *)&baseLinkName);
  return true;
}

Assistant:

bool CreateModelFromDHChain(const DHChain& inputChain,
                                  Model& outputModel)
{
    // First we clear the model
    outputModel = Model();

    // All the inertial will be of one kg in the origin
    iDynTree::SpatialInertia inertiaDefault(1.0,Position::Zero(),RotationalInertia::Zero());
    iDynTree::Link linkDefault;
    linkDefault.setInertia(inertiaDefault);

    std::string baseLinkName  = "link0";


    // Then we create a base link
    outputModel.addLink(baseLinkName,linkDefault);

    std::string previousLinkName = baseLinkName;

    for(int i=0; i<inputChain.getNrOfDOFs(); i++)
    {
        std::string addedJointName = inputChain.getDOFName(i);
        std::string addedLinkName = "link"+intToString(i+1);

        Transform parent_H_child;
        Axis rot_axis_in_parent_frame;
        Axis axisOnZThroughOrigin = Axis(Direction(0.0,0.0,1.0),Position::Zero());
        Transform dhTransform = TransformFromDH(inputChain(i).A,inputChain(i).Alpha,inputChain(i).D,inputChain(i).Offset);
        parent_H_child = dhTransform;
        rot_axis_in_parent_frame = axisOnZThroughOrigin;

        RevoluteJoint addedJoint = RevoluteJoint(parent_H_child,rot_axis_in_parent_frame);
        outputModel.addJointAndLink(previousLinkName,
                                    addedJointName,&(addedJoint),
                                    addedLinkName,linkDefault);

        previousLinkName = addedLinkName;
    }

    // Add base and end effector additional frames, using the H0 and HN information
    outputModel.addAdditionalFrameToLink(baseLinkName,"baseFrame",inputChain.getH0().inverse());
    outputModel.addAdditionalFrameToLink("link"+intToString(inputChain.getNrOfDOFs()),"distalFrame",inputChain.getHN());

    return true;
}